

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O0

void Assimp::FBX::Util::EncodeByteBlock(char *bytes,string *out_string,size_t string_pos)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  char *pcVar7;
  char b3;
  char b2;
  char b1;
  char b0;
  size_t string_pos_local;
  string *out_string_local;
  char *bytes_local;
  
  bVar1 = *bytes;
  cVar6 = bytes[1];
  bVar2 = bytes[1];
  cVar3 = bytes[2];
  bVar4 = bytes[2];
  cVar5 = EncodeBase64((char)((int)((int)*bytes & 0xfcU) >> 2));
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)out_string);
  *pcVar7 = cVar5;
  cVar6 = EncodeBase64((bVar1 & 3) << 4 | (byte)((int)((int)cVar6 & 0xf0U) >> 4));
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)out_string);
  *pcVar7 = cVar6;
  cVar6 = EncodeBase64((bVar2 & 0xf) << 2 | (byte)((int)((int)cVar3 & 0xc0U) >> 6));
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)out_string);
  *pcVar7 = cVar6;
  cVar6 = EncodeBase64(bVar4 & 0x3f);
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)out_string);
  *pcVar7 = cVar6;
  return;
}

Assistant:

void EncodeByteBlock(const char* bytes, std::string& out_string, size_t string_pos)
{
    char b0 = (bytes[0] & 0xFC) >> 2;
    char b1 = (bytes[0] & 0x03) << 4 | ((bytes[1] & 0xF0) >> 4);
    char b2 = (bytes[1] & 0x0F) << 2 | ((bytes[2] & 0xC0) >> 6);
    char b3 = (bytes[2] & 0x3F);

    out_string[string_pos + 0] = EncodeBase64(b0);
    out_string[string_pos + 1] = EncodeBase64(b1);
    out_string[string_pos + 2] = EncodeBase64(b2);
    out_string[string_pos + 3] = EncodeBase64(b3);
}